

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Line_AlignCeiling
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  bool bVar1;
  int linenum;
  byte bVar2;
  FLineIdIterator itr;
  
  itr.start = tagManager.IDHashFirst[(ulong)(uint)arg0 & 0xff];
  itr.searchtag = arg0;
  bVar2 = 0;
  while( true ) {
    linenum = FLineIdIterator::Next(&itr);
    if (linenum < 0) break;
    bVar1 = P_AlignFlat(linenum,(uint)(arg1 != 0),1);
    bVar2 = bVar2 | bVar1;
  }
  return (uint)bVar2;
}

Assistant:

FUNC(LS_Line_AlignCeiling)
// Line_AlignCeiling (lineid, side)
{
	bool ret = 0;

	FLineIdIterator itr(arg0);
	int line;
	while ((line = itr.Next()) >= 0)
	{
		ret |= P_AlignFlat (line, !!arg1, 1);
	}
	return ret;
}